

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O2

Lazy<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>_>
__thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
operator()(WRRLoadBlancer *this,
          load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> *load_blancer)

{
  pointer piVar1;
  undefined8 in_RDX;
  
  piVar1 = (pointer)operator_new(0x58,(nothrow_t *)&std::nothrow);
  if (piVar1 == (pointer)0x0) {
    (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
  }
  else {
    *(code **)piVar1 = operator();
    *(code **)(piVar1 + 2) = operator();
    *(undefined8 *)(piVar1 + 0x12) = in_RDX;
    *(load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool> **)(piVar1 + 0x10) =
         load_blancer;
    piVar1[4] = 0;
    piVar1[5] = 0;
    piVar1[6] = 0;
    piVar1[7] = 0;
    piVar1[8] = 0;
    piVar1[9] = 0;
    *(undefined1 *)(piVar1 + 0xe) = 0;
    (this->weights_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = piVar1;
    *(undefined1 *)(piVar1 + 0x14) = 0;
  }
  return (LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
          )(LazyBase<std::shared_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>,_false>
            )this;
}

Assistant:

async_simple::coro::Lazy<std::shared_ptr<client_pool_t>> operator()(
        const load_blancer& load_blancer) {
      int selected = select_host_with_weight_round_robin();
      if (selected == -1) {
        selected = 0;
      }

      wrr_current_ = selected;
      co_return load_blancer
          .client_pools_[selected % load_blancer.client_pools_.size()];
    }